

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::initializeMapBuilder
          (CommonCore *this,string_view request,uint16_t index,QueryReuse reuse,bool force_ordering)

{
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  bool bVar1;
  FederateStates FVar2;
  BrokerState BVar3;
  int iVar4;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *p_Var5;
  size_t sVar6;
  JsonMapBuilder *this_00;
  FederateState *pFVar7;
  pointer pBVar8;
  undefined4 extraout_var;
  reference pvVar9;
  ushort in_CX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  in_R8B;
  byte in_R9B;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  json tagBlock;
  GlobalFederateId *dep_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range4_1;
  GlobalFederateId *dep;
  iterator __end4;
  iterator __begin4;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *__range4;
  string ret_2;
  int brkindex_2;
  string ret_1;
  int brkindex_1;
  string ret;
  int brkindex;
  FedInfo *fed;
  const_iterator __end2;
  const_iterator __begin2;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range2;
  ActionMessage queryReq;
  json *base;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *builder;
  FilterFederate *in_stack_00000708;
  string_view in_stack_00000710;
  ActionMessage *in_stack_fffffffffffffa08;
  FederateState *in_stack_fffffffffffffa10;
  reference in_stack_fffffffffffffa18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 uVar10;
  action_t in_stack_fffffffffffffa2c;
  undefined4 uVar11;
  ActionMessage *in_stack_fffffffffffffa30;
  SmallBuffer *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  undefined6 in_stack_fffffffffffffa58;
  undefined2 in_stack_fffffffffffffa5e;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffa60;
  BaseTimeCoordinator *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined2 in_stack_fffffffffffffa74;
  undefined2 in_stack_fffffffffffffa76;
  string *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  undefined8 in_stack_fffffffffffffa88;
  BrokerState state;
  undefined4 in_stack_fffffffffffffae4;
  undefined1 hasParent;
  json *in_stack_fffffffffffffae8;
  BrokerBase *in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffb4c;
  string *info;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_428;
  long local_420;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_418 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_3f8 [3];
  BaseType local_3c4;
  GlobalFederateId *local_3b0;
  GlobalFederateId *local_3a8;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_3a0;
  undefined1 local_398 [24];
  undefined1 *local_380;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_378 [2];
  BaseType local_354;
  GlobalFederateId *local_340;
  GlobalFederateId *local_338;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_330;
  undefined1 local_328 [24];
  undefined1 *local_310;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_308 [2];
  undefined8 local_2e8;
  double local_2e0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 in_stack_fffffffffffffd67;
  GlobalFederateId in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  CommonCore *in_stack_fffffffffffffd70;
  string_view in_stack_fffffffffffffd78;
  GlobalFederateId local_230;
  allocator<char> local_229 [37];
  int local_204;
  BaseType local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  GlobalFederateId local_190;
  allocator<char> local_189 [37];
  int local_164;
  FedInfo *local_160;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_158;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_140;
  long local_128;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_120;
  undefined1 local_110 [40];
  ActionMessage local_e8;
  json *local_30;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *local_28;
  byte local_1c;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  local_1b;
  ushort local_1a;
  undefined8 local_10;
  undefined8 uStack_8;
  
  hasParent = (undefined1)((uint)in_stack_fffffffffffffae4 >> 0x18);
  local_1c = in_R9B & 1;
  local_1b = in_R8B;
  local_1a = in_CX;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  bVar1 = isValidIndex<unsigned_short,std::vector<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>,std::allocator<std::tuple<helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>>>>
                    ((unsigned_short)((ulong)in_stack_fffffffffffffa10 >> 0x30),
                     (vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                      *)in_stack_fffffffffffffa08);
  if (!bVar1) {
    std::
    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
    ::resize((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
              *)in_stack_fffffffffffffa30,
             CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  }
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                *)(in_RDI + 0xad0),(ulong)local_1a);
  p_Var5 = std::
           get<2ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                     ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                       *)0x542cc0);
  *p_Var5 = local_1b;
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::operator[]((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                *)(in_RDI + 0xad0),(ulong)local_1a);
  local_28 = std::
             get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                       ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                         *)0x542cef);
  fileops::JsonMapBuilder::reset((JsonMapBuilder *)in_stack_fffffffffffffa10);
  local_30 = fileops::JsonMapBuilder::getJValue_abi_cxx11_
                       ((JsonMapBuilder *)in_stack_fffffffffffffa10);
  BrokerBase::addBaseInformation
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,(bool)hasParent);
  ActionMessage::ActionMessage(in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  if (local_1a == 8) {
    ActionMessage::setAction(&local_e8,cmd_query_ordered);
  }
  SmallBuffer::operator=
            (in_stack_fffffffffffffa38,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa30);
  local_110._20_4_ = *(BaseType *)(in_RDI + 0x14);
  GlobalFederateId::GlobalFederateId
            ((GlobalFederateId *)(local_110 + 0x18),(GlobalBrokerId)local_110._20_4_);
  local_e8.source_id.gid = local_110._24_4_;
  local_e8.counter = local_1a;
  sVar6 = gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::size((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                  *)0x542e06);
  state = (BrokerState)((ulong)in_stack_fffffffffffffa88 >> 0x30);
  if (((sVar6 != 0) || (*(long *)(in_RDI + 0xae8) != 0)) || (*(long *)(in_RDI + 0x948) != 0)) {
    CLI::std::
    initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
    ::initializer_list(&local_120);
    init._M_len._0_4_ = in_stack_fffffffffffffa28;
    init._M_array = (iterator)in_stack_fffffffffffffa20;
    init._M_len._4_4_ = in_stack_fffffffffffffa2c;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    this_00 = (JsonMapBuilder *)
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        (in_stack_fffffffffffffa60,
                         (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
    info = (string *)local_110;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa10);
    local_128 = in_RDI + 0x470;
    gmlc::containers::
    DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
    begin((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
           *)in_stack_fffffffffffffa10);
    gmlc::containers::
    DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
    end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
         *)in_stack_fffffffffffffa10);
    while( true ) {
      bVar1 = gmlc::containers::
              BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator!=
                        (&local_140,&local_158);
      state = (BrokerState)((ulong)in_stack_fffffffffffffa88 >> 0x30);
      in_stack_fffffffffffffb4c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb4c);
      if (!bVar1) break;
      local_160 = gmlc::containers::
                  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
                  operator*(&local_140);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
      pFVar7 = FedInfo::operator->(local_160);
      local_190 = std::atomic<helics::GlobalFederateId>::load(&pFVar7->global_id,seq_cst);
      GlobalFederateId::baseValue(&local_190);
      iVar4 = fileops::JsonMapBuilder::generatePlaceHolder
                        ((JsonMapBuilder *)
                         CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                         in_stack_fffffffffffffa78,
                         CONCAT22(in_stack_fffffffffffffa76,in_stack_fffffffffffffa74));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
      std::allocator<char>::~allocator(local_189);
      local_1c8 = local_10;
      uStack_1c0 = uStack_8;
      local_164 = iVar4;
      federateQuery_abi_cxx11_
                (in_stack_fffffffffffffd70,
                 (FederateState *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.gid),
                 in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd67);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08);
      if (bVar1) {
        FedInfo::operator->(local_160);
        FVar2 = FederateState::getState((FederateState *)0x5430b1);
        if (FVar2 < TERMINATING) {
          local_e8.messageID = local_164;
          local_1cc = (BaseType)
                      std::atomic::operator_cast_to_GlobalFederateId
                                ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffa08);
          local_e8.dest_id = (GlobalFederateId)local_1cc;
          FederateState::addAction(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        }
        else {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18);
          federateQuery_abi_cxx11_
                    (in_stack_fffffffffffffd70,
                     (FederateState *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68.gid),
                     in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd67);
          fileops::JsonMapBuilder::addComponent(this_00,info,in_stack_fffffffffffffb4c);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa10);
        }
      }
      else {
        fileops::JsonMapBuilder::addComponent(this_00,info,in_stack_fffffffffffffb4c);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
      gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
      operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                 in_stack_fffffffffffffa10);
    }
    if (*(long *)(in_RDI + 0xae8) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
      local_230 = std::atomic<helics::GlobalFederateId>::load
                            ((atomic<helics::GlobalFederateId> *)(in_RDI + 0xaf8),seq_cst);
      GlobalFederateId::baseValue(&local_230);
      iVar4 = fileops::JsonMapBuilder::generatePlaceHolder
                        ((JsonMapBuilder *)
                         CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                         in_stack_fffffffffffffa78,
                         CONCAT22(in_stack_fffffffffffffa76,in_stack_fffffffffffffa74));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
      std::allocator<char>::~allocator(local_229);
      local_204 = iVar4;
      FilterFederate::query_abi_cxx11_(in_stack_00000708,in_stack_00000710);
      fileops::JsonMapBuilder::addComponent(this_00,info,in_stack_fffffffffffffb4c);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
    }
    if (*(long *)(in_RDI + 0x948) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40));
      std::atomic<helics::GlobalFederateId>::load
                ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x958),seq_cst);
      GlobalFederateId::baseValue((GlobalFederateId *)&stack0xfffffffffffffd68);
      fileops::JsonMapBuilder::generatePlaceHolder
                ((JsonMapBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                 in_stack_fffffffffffffa78,
                 CONCAT22(in_stack_fffffffffffffa76,in_stack_fffffffffffffa74));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
      local_2c8 = local_10;
      uStack_2c0 = uStack_8;
      TranslatorFederate::query_abi_cxx11_
                ((TranslatorFederate *)in_stack_00000708,in_stack_00000710);
      fileops::JsonMapBuilder::addComponent(this_00,info,in_stack_fffffffffffffb4c);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa10);
    }
  }
  switch(local_1a) {
  case 2:
  case 9:
    if ((*(byte *)(in_RDI + 0x211) & 1) != 0) {
      pBVar8 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x54360c);
      iVar4 = (*pBVar8->_vptr_BaseTimeCoordinator[0xd])();
      local_2e8 = CONCAT44(extraout_var,iVar4);
      local_2e0 = TimeRepresentation::operator_cast_to_double
                            ((TimeRepresentation<count_time<9,_long>_> *)0x54363f);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<double,_double,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffa10,(double *)in_stack_fffffffffffffa08);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>
                (in_stack_fffffffffffffa60,
                 (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa10);
    }
    break;
  case 3:
    if ((*(byte *)(in_RDI + 0x211) & 1) != 0) {
      CLI::std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list(local_308);
      init_00._M_len._0_4_ = in_stack_fffffffffffffa28;
      init_00._M_array = (iterator)in_stack_fffffffffffffa20;
      init_00._M_len._4_4_ = in_stack_fffffffffffffa2c;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init_00);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>
                (in_stack_fffffffffffffa60,
                 (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa10);
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x543767);
      BaseTimeCoordinator::getDependents(in_stack_fffffffffffffa68);
      local_310 = local_328;
      local_330._M_current =
           (GlobalFederateId *)
           std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                     ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                      )in_stack_fffffffffffffa08);
      local_338 = (GlobalFederateId *)
                  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                  end((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                      )in_stack_fffffffffffffa08);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                               ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 *)in_stack_fffffffffffffa10,
                                (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 *)in_stack_fffffffffffffa08), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_340 = __gnu_cxx::
                    __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                    ::operator*(&local_330);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  (in_stack_fffffffffffffa60,
                   (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
        local_354 = GlobalFederateId::baseValue(local_340);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffa10,&in_stack_fffffffffffffa08->messageAction);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT26(in_stack_fffffffffffffa76,
                                CONCAT24(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa68);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffa10);
        __gnu_cxx::
        __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
        ::operator++(&local_330);
      }
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 in_stack_fffffffffffffa20);
      CLI::std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list(local_378);
      init_01._M_len._0_4_ = in_stack_fffffffffffffa28;
      init_01._M_array = (iterator)in_stack_fffffffffffffa20;
      init_01._M_len._4_4_ = in_stack_fffffffffffffa2c;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init_01);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>
                (in_stack_fffffffffffffa60,
                 (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa10);
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x543981);
      BaseTimeCoordinator::getDependencies(in_stack_fffffffffffffa68);
      local_380 = local_398;
      local_3a0._M_current =
           (GlobalFederateId *)
           std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
                     ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                      )in_stack_fffffffffffffa08);
      local_3a8 = (GlobalFederateId *)
                  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
                  end((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *
                      )in_stack_fffffffffffffa08);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                               ((__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 *)in_stack_fffffffffffffa10,
                                (__normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                                 *)in_stack_fffffffffffffa08), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_3b0 = __gnu_cxx::
                    __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                    ::operator*(&local_3a0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  (in_stack_fffffffffffffa60,
                   (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
        local_3c4 = GlobalFederateId::baseValue(local_3b0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffa10,&in_stack_fffffffffffffa08->messageAction);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)CONCAT26(in_stack_fffffffffffffa76,
                                CONCAT24(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa68);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffa10);
        __gnu_cxx::
        __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
        ::operator++(&local_3a0);
      }
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::~vector
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 in_stack_fffffffffffffa20);
    }
    break;
  default:
    break;
  case 6:
    BrokerBase::getBrokerState((BrokerBase *)0x543b1f);
    brokerStateName_abi_cxx11_(state);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffa30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              (in_stack_fffffffffffffa60,
               (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa10);
    break;
  case 7:
    BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x543bc4);
    brokerStateName_abi_cxx11_(state);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffffa30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              (in_stack_fffffffffffffa60,(char *)CONCAT26(BVar3,in_stack_fffffffffffffa58));
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa10);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                        *)0x543c45);
    if (bVar1) {
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x543c62);
      bVar1 = BaseTimeCoordinator::empty((BaseTimeCoordinator *)0x543c6a);
      if (!bVar1) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::operator[]<char_const>
                  (in_stack_fffffffffffffa60,(char *)CONCAT26(BVar3,in_stack_fffffffffffffa58));
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=(local_3f8,in_stack_fffffffffffffa18);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffa10);
        pBVar8 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x543cdf);
        uVar10 = SUB84(pBVar8,0);
        uVar11 = (undefined4)((ulong)pBVar8 >> 0x20);
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           (in_stack_fffffffffffffa60,
                            (char *)CONCAT26(BVar3,in_stack_fffffffffffffa58));
        (**(code **)(*(long *)CONCAT44(uVar11,uVar10) + 0x60))
                  ((long *)CONCAT44(uVar11,uVar10),pvVar9);
      }
    }
    break;
  case 0xe:
    bVar1 = CLI::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffa20);
    if (!bVar1) {
      CLI::std::
      initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::initializer_list(local_418);
      init_02._M_len._0_4_ = in_stack_fffffffffffffa28;
      init_02._M_array = (iterator)in_stack_fffffffffffffa20;
      init_02._M_len._4_4_ = in_stack_fffffffffffffa2c;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::object(init_02);
      local_420 = in_RDI + 0x3c0;
      local_428._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CLI::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffa08);
      CLI::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffa08);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)in_stack_fffffffffffffa10,
                                (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)in_stack_fffffffffffffa08), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator*(&local_428);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffa30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        std::__cxx11::string::string(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
        in_stack_fffffffffffffa18 =
             nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (key_type *)in_stack_fffffffffffffa78);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa10);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffa10);
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&local_428);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)CONCAT26(in_stack_fffffffffffffa76,
                               CONCAT24(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70)),
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffa68);
      in_stack_fffffffffffffa10 =
           (FederateState *)
           nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     (in_stack_fffffffffffffa60,
                      (char *)CONCAT26(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58));
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa10);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffa10);
    }
  }
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa10);
  return;
}

Assistant:

void CommonCore::initializeMapBuilder(std::string_view request,
                                      std::uint16_t index,
                                      QueryReuse reuse,
                                      bool force_ordering) const
{
    if (!isValidIndex(index, mapBuilders)) {
        mapBuilders.resize(static_cast<size_t>(index) + 1);
    }
    std::get<2>(mapBuilders[index]) = reuse;
    auto& builder = std::get<0>(mapBuilders[index]);
    builder.reset();
    nlohmann::json& base = builder.getJValue();
    addBaseInformation(base, true);
    ActionMessage queryReq(force_ordering ? CMD_QUERY_ORDERED : CMD_QUERY);
    if (index == GLOBAL_FLUSH) {
        queryReq.setAction(CMD_QUERY_ORDERED);
    }
    queryReq.payload = request;
    queryReq.source_id = global_broker_id_local;
    queryReq.counter = index;  // indicating which processing to use
    if (loopFederates.size() > 0 || filterFed != nullptr || translatorFed != nullptr) {
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : loopFederates) {
            const int brkindex =
                builder.generatePlaceHolder("federates", fed->global_id.load().baseValue());
            const std::string ret = federateQuery(fed.fed, request, force_ordering);
            if (ret == "#wait") {
                if (fed->getState() <= FederateStates::EXECUTING) {
                    queryReq.messageID = brkindex;
                    queryReq.dest_id = fed.fed->global_id;
                    fed.fed->addAction(queryReq);
                } else {
                    // the federate has terminated or errored so is waiting, global_state doesn't
                    // block
                    builder.addComponent(federateQuery(fed.fed, "global_state", force_ordering),
                                         brkindex);
                }
            } else {
                builder.addComponent(ret, brkindex);
            }
        }
        if (filterFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", filterFedID.load().baseValue());
            const std::string ret = filterFed->query(request);
            builder.addComponent(ret, brkindex);
        }
        if (translatorFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", translatorFedID.load().baseValue());
            const std::string ret = translatorFed->query(request);
            builder.addComponent(ret, brkindex);
        }
    }

    switch (index) {
        case CURRENT_TIME_MAP:
        case GLOBAL_STATUS:
            if (hasTimeDependency) {
                base["next_time"] = static_cast<double>(timeCoord->getNextTime());
            }
            break;
        case DEPENDENCY_GRAPH: {
            if (hasTimeDependency) {
                base["dependents"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependents()) {
                    base["dependents"].push_back(dep.baseValue());
                }
                base["dependencies"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependencies()) {
                    base["dependencies"].push_back(dep.baseValue());
                }
            }
        } break;
        case GLOBAL_STATE:
            base["state"] = brokerStateName(getBrokerState());
            break;
        case GLOBAL_TIME_DEBUGGING:
            base["state"] = brokerStateName(getBrokerState());
            if (timeCoord && !timeCoord->empty()) {
                base["time"] = nlohmann::json();
                timeCoord->generateDebuggingTimeInfo(base["time"]);
            }
            break;
        case UNCONNECTED_INTERFACES:
            if (!tags.empty()) {
                nlohmann::json tagBlock = nlohmann::json::object();
                for (const auto& tag : tags) {
                    tagBlock[tag.first] = tag.second;
                }
                base["tags"] = tagBlock;
            }
            break;
        default:
            break;
    }
}